

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptForConfig
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  string *d;
  pointer in_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  GetDirectories(&local_c8,this,config);
  this_00 = this->LocalGenerator->Makefile;
  for (in_name = local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      in_name !=
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; in_name = in_name + 1) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar1) {
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
      local_80.View_._M_str = (psVar2->_M_dataplus)._M_p;
      local_80.View_._M_len = psVar2->_M_string_length;
      local_b0.View_._M_len = 1;
      local_b0.View_._M_str = "/";
      cmStrCat<std::__cxx11::string>(&local_50,&local_80,&local_b0,in_name);
      std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  AddDirectoryInstallRule(this,os,config,indent,&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::vector<std::string> dirs = this->GetDirectories(config);

  // Make sure all dirs have absolute paths.
  cmMakefile const& mf = *this->LocalGenerator->GetMakefile();
  for (std::string& d : dirs) {
    if (!cmSystemTools::FileIsFullPath(d)) {
      d = cmStrCat(mf.GetCurrentSourceDirectory(), "/", d);
    }
  }

  this->AddDirectoryInstallRule(os, config, indent, dirs);
}